

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

void __thiscall
soul::RewritingASTVisitor::replaceStatement
          (RewritingASTVisitor *this,pool_ptr<soul::AST::Statement> *s)

{
  RewritingASTVisitor local_28;
  
  local_28.itemsReplaced = (size_t)s->object;
  visitAs<soul::AST::Statement>(&local_28,(pool_ptr<soul::AST::Statement> *)this);
  if (s->object != (Statement *)local_28._vptr_RewritingASTVisitor) {
    this->itemsReplaced = this->itemsReplaced + 1;
    s->object = (Statement *)local_28._vptr_RewritingASTVisitor;
  }
  return;
}

Assistant:

void replaceStatement (pool_ptr<AST::Statement>& s)           { replace (s, visitStatement (s)); }